

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_LogInt(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  DObject *this;
  bool bVar1;
  bool local_3f;
  int num;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc94,
                  "int AF_AActor_A_LogInt(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc94,
                  "int AF_AActor_A_LogInt(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_3f = true;
  if (this != (DObject *)0x0) {
    local_3f = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_3f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc94,
                  "int AF_AActor_A_LogInt(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc95,
                  "int AF_AActor_A_LogInt(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc95,
                  "int AF_AActor_A_LogInt(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  Printf("%d\n",(ulong)(uint)param[1].field_0.i);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LogInt)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(num);
	Printf("%d\n", num);
	return 0;
}